

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  byte bVar1;
  byte *__s;
  symbol *psVar2;
  ushort *puVar3;
  void *__ptr;
  size_t __nmemb;
  int iVar4;
  uint uVar5;
  void *__ptr_00;
  char *pcVar6;
  ushort **ppuVar7;
  byte *pbVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  byte *pbVar15;
  ulong uVar16;
  ulong uVar17;
  int local_68;
  
  uVar14 = lemp->nsymbol;
  __nmemb = (long)(int)uVar14 * 2;
  __ptr_00 = calloc(__nmemb,8);
  if (__ptr_00 != (void *)0x0) {
    __s = (byte *)lemp->vartype;
    uVar12 = 0;
    sVar13 = 0;
    if (__s != (byte *)0x0) {
      sVar13 = strlen((char *)__s);
    }
    uVar17 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar17 = uVar12;
    }
    for (; uVar14 = (uint)sVar13, uVar17 != uVar12; uVar12 = uVar12 + 1) {
      pcVar6 = lemp->symbols[uVar12]->datatype;
      if (pcVar6 != (char *)0x0) {
        sVar13 = strlen(pcVar6);
        uVar5 = (uint)sVar13;
        if ((int)(uint)sVar13 < (int)uVar14) {
          uVar5 = uVar14;
        }
        sVar13 = (size_t)uVar5;
      }
    }
    pcVar6 = (char *)malloc((long)(int)(uVar14 * 2 + 1));
    if (pcVar6 != (char *)0x0) {
      uVar14 = (uint)__nmemb;
      uVar12 = 0;
      do {
        if (uVar12 == uVar17) {
          pcVar10 = "Parse";
          if (lemp->name != (char *)0x0) {
            pcVar10 = lemp->name;
          }
          local_68 = *plineno;
          if (mhflag != 0) {
            fwrite("#if INTERFACE\n",0xe,1,(FILE *)out);
            local_68 = local_68 + 1;
          }
          pcVar11 = "void*";
          if (lemp->tokentype != (char *)0x0) {
            pcVar11 = lemp->tokentype;
          }
          fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",pcVar10,pcVar11);
          if (mhflag == 0) {
            local_68 = local_68 + 1;
          }
          else {
            fwrite("#endif\n",7,1,(FILE *)out);
            local_68 = local_68 + 2;
          }
          fwrite("typedef union {\n",0x10,1,(FILE *)out);
          fwrite("  int yyinit;\n",0xe,1,(FILE *)out);
          fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",pcVar10);
          local_68 = local_68 + 3;
          uVar12 = __nmemb & 0xffffffff;
          if ((int)uVar14 < 1) {
            uVar12 = 0;
          }
          uVar17 = 0;
          while (uVar12 != uVar17) {
            __ptr = *(void **)((long)__ptr_00 + uVar17 * 8);
            uVar17 = uVar17 + 1;
            if (__ptr != (void *)0x0) {
              fprintf((FILE *)out,"  %s yy%d;\n",__ptr,uVar17 & 0xffffffff);
              local_68 = local_68 + 1;
              free(__ptr);
            }
          }
          if (lemp->errsym->useCnt != 0) {
            fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)lemp->errsym->dtnum);
            local_68 = local_68 + 1;
          }
          free(pcVar6);
          free(__ptr_00);
          fwrite("} YYMINORTYPE;\n",0xf,1,(FILE *)out);
          *plineno = local_68 + 1;
          return;
        }
        psVar2 = lemp->symbols[uVar12];
        if (psVar2 == lemp->errsym) {
          psVar2->dtnum = uVar14 | 1;
        }
        else if ((psVar2->type == NONTERMINAL) &&
                (pbVar15 = (byte *)psVar2->datatype, __s != (byte *)0x0 || pbVar15 != (byte *)0x0))
        {
          if (pbVar15 == (byte *)0x0) {
            pbVar15 = __s;
          }
          ppuVar7 = __ctype_b_loc();
          puVar3 = *ppuVar7;
          pbVar8 = pbVar15 + -1;
          do {
            pbVar15 = pbVar15 + 1;
            uVar16 = (ulong)pbVar8[1];
            pbVar8 = pbVar8 + 1;
          } while ((*(byte *)((long)puVar3 + uVar16 * 2 + 1) & 0x20) != 0);
          uVar9 = 0;
          while ((char)uVar16 != '\0') {
            pcVar6[uVar9] = (char)uVar16;
            uVar9 = uVar9 + 1;
            bVar1 = *pbVar15;
            pbVar15 = pbVar15 + 1;
            uVar16 = (ulong)bVar1;
          }
          for (; 0 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
            if ((*(byte *)((long)puVar3 + (ulong)(byte)pcVar6[(uVar9 & 0xffffffff) - 1] * 2 + 1) &
                0x20) == 0) goto LAB_0010b084;
          }
          uVar9 = 0;
LAB_0010b084:
          pcVar6[uVar9 & 0xffffffff] = '\0';
          if ((lemp->tokentype == (char *)0x0) ||
             (iVar4 = strcmp(pcVar6,lemp->tokentype), iVar4 != 0)) {
            uVar5 = 0;
            for (pcVar10 = pcVar6; *pcVar10 != '\0'; pcVar10 = pcVar10 + 1) {
              uVar5 = uVar5 * 0x35 + (int)*pcVar10;
            }
            uVar16 = ((ulong)uVar5 & 0xffffffff7fffffff) % (__nmemb & 0xffffffff);
            while( true ) {
              pcVar10 = *(char **)((long)__ptr_00 + uVar16 * 8);
              if (pcVar10 == (char *)0x0) break;
              iVar4 = strcmp(pcVar10,pcVar6);
              uVar5 = (int)uVar16 + 1;
              if (iVar4 == 0) {
                psVar2->dtnum = uVar5;
                goto LAB_0010b140;
              }
              if (uVar14 <= uVar5) {
                uVar5 = 0;
              }
              uVar16 = (ulong)uVar5;
            }
            psVar2->dtnum = (int)uVar16 + 1;
            sVar13 = strlen(pcVar6);
            pcVar10 = (char *)malloc((long)((int)sVar13 + 1));
            *(char **)((long)__ptr_00 + uVar16 * 8) = pcVar10;
            if (pcVar10 == (char *)0x0) break;
            strcpy(pcVar10,pcVar6);
          }
          else {
            psVar2->dtnum = 0;
          }
        }
        else {
          psVar2->dtnum = 0;
        }
LAB_0010b140:
        uVar12 = uVar12 + 1;
      } while( true );
    }
  }
  fwrite("Out of memory.\n",0xf,1,_stderr);
  exit(1);
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = *plineno;    /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( types==0 || stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}